

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

char * readString(void)

{
  int iVar1;
  char *pcVar2;
  int local_18;
  char local_11;
  int i;
  char c;
  char *ret;
  
  _i = (void *)0x0;
  iVar1 = getchar();
  local_18 = 0;
  local_11 = (char)iVar1;
  while (local_11 != ' ' && local_11 != '\n') {
    _i = realloc(_i,(long)(local_18 + 1));
    *(char *)((long)_i + (long)local_18) = local_11;
    iVar1 = getchar();
    local_18 = local_18 + 1;
    local_11 = (char)iVar1;
  }
  pcVar2 = (char *)realloc(_i,(long)(local_18 + 1));
  pcVar2[local_18] = '\0';
  return pcVar2;
}

Assistant:

static char* readString(){
    char *ret = NULL;
    char c = getchar();
    int i = 0;
    while(c != ' ' && c != '\n'){
        i++;
        ret = (char *)reallocate(ret, sizeof(char)*i);
        ret[i - 1] = c;
        c = getchar();
    }
    ret = (char *)reallocate(ret, sizeof(char) * (i + 1));
    ret[i] = '\0';
    return ret;
}